

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

void __thiscall
LNodeIEStmt::LNodeIEStmt
          (LNodeIEStmt *this,shared_ptr<LNode> *condition,shared_ptr<LNode> *then_branch,
          shared_ptr<LNode> *else_branch)

{
  (this->else_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->else_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->then_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->then_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->condition).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->condition).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)this,
             &condition->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->then_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>,
             &then_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->else_branch).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>,
             &else_branch->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

LNodeIEStmt(std::shared_ptr<LNode> condition,
                std::shared_ptr<LNode> then_branch, std::shared_ptr<LNode> else_branch) {
        this->condition = std::move(condition);
        this->then_branch = std::move(then_branch);
        this->else_branch = std::move(else_branch);
    }